

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O0

void __thiscall helics::InvalidParameter::~InvalidParameter(InvalidParameter *this)

{
  void *in_RDI;
  
  ~InvalidParameter((InvalidParameter *)0x257b48);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

explicit InvalidParameter(std::string_view message = "invalid parameter") noexcept:
        HelicsException(message)
    {
    }